

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::PairMatcherImpl<const_std::pair<const_int,_int>_&>::MatchAndExplain
          (PairMatcherImpl<const_std::pair<const_int,_int>_&> *this,pair<const_int,_int> *a_pair,
          MatchResultListener *listener)

{
  bool bVar1;
  int *piVar2;
  ostream *poVar3;
  bool local_411;
  string local_408;
  string local_3e8;
  string local_3c8;
  undefined1 local_3a0 [8];
  StringMatchResultListener second_inner_listener;
  string local_200;
  undefined1 local_1c8 [8];
  StringMatchResultListener first_inner_listener;
  MatchResultListener *listener_local;
  pair<const_int,_int> *a_pair_local;
  PairMatcherImpl<const_std::pair<const_int,_int>_&> *this_local;
  
  bVar1 = MatchResultListener::IsInterested(listener);
  if (bVar1) {
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1c8);
    piVar2 = pair_getters::First<std::pair<int_const,int>const>(a_pair);
    bVar1 = MatcherBase<const_int_&>::MatchAndExplain
                      (&(this->first_matcher_).super_MatcherBase<const_int_&>,piVar2,
                       (MatchResultListener *)local_1c8);
    if (bVar1) {
      StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_3a0);
      piVar2 = pair_getters::Second<std::pair<int_const,int>const>(a_pair);
      this_local._7_1_ =
           MatcherBase<const_int_&>::MatchAndExplain
                     (&(this->second_matcher_).super_MatcherBase<const_int_&>,piVar2,
                      (MatchResultListener *)local_3a0);
      if (this_local._7_1_) {
        StringMatchResultListener::str_abi_cxx11_(&local_3e8,(StringMatchResultListener *)local_1c8)
        ;
        StringMatchResultListener::str_abi_cxx11_(&local_408,(StringMatchResultListener *)local_3a0)
        ;
        ExplainSuccess(this,&local_3e8,&local_408,listener);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_3e8);
      }
      else {
        MatchResultListener::operator<<(listener,(char (*) [34])"whose second field does not match")
        ;
        StringMatchResultListener::str_abi_cxx11_(&local_3c8,(StringMatchResultListener *)local_3a0)
        ;
        poVar3 = MatchResultListener::stream(listener);
        PrintIfNotEmpty(&local_3c8,poVar3);
        std::__cxx11::string::~string((string *)&local_3c8);
      }
      second_inner_listener._404_4_ = 1;
      StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_3a0);
    }
    else {
      MatchResultListener::operator<<(listener,(char (*) [33])"whose first field does not match");
      StringMatchResultListener::str_abi_cxx11_(&local_200,(StringMatchResultListener *)local_1c8);
      poVar3 = MatchResultListener::stream(listener);
      PrintIfNotEmpty(&local_200,poVar3);
      std::__cxx11::string::~string((string *)&local_200);
      this_local._7_1_ = false;
      second_inner_listener._404_4_ = 1;
    }
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1c8);
  }
  else {
    piVar2 = pair_getters::First<std::pair<int_const,int>const>(a_pair);
    bVar1 = MatcherBase<const_int_&>::Matches
                      (&(this->first_matcher_).super_MatcherBase<const_int_&>,piVar2);
    local_411 = false;
    if (bVar1) {
      piVar2 = pair_getters::Second<std::pair<int_const,int>const>(a_pair);
      local_411 = MatcherBase<const_int_&>::Matches
                            (&(this->second_matcher_).super_MatcherBase<const_int_&>,piVar2);
    }
    this_local._7_1_ = local_411;
  }
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(PairType a_pair,
                       MatchResultListener* listener) const override {
    if (!listener->IsInterested()) {
      // If the listener is not interested, we don't need to construct the
      // explanation.
      return first_matcher_.Matches(pair_getters::First(a_pair, Rank1())) &&
             second_matcher_.Matches(pair_getters::Second(a_pair, Rank1()));
    }
    StringMatchResultListener first_inner_listener;
    if (!first_matcher_.MatchAndExplain(pair_getters::First(a_pair, Rank1()),
                                        &first_inner_listener)) {
      *listener << "whose first field does not match";
      PrintIfNotEmpty(first_inner_listener.str(), listener->stream());
      return false;
    }
    StringMatchResultListener second_inner_listener;
    if (!second_matcher_.MatchAndExplain(pair_getters::Second(a_pair, Rank1()),
                                         &second_inner_listener)) {
      *listener << "whose second field does not match";
      PrintIfNotEmpty(second_inner_listener.str(), listener->stream());
      return false;
    }
    ExplainSuccess(first_inner_listener.str(), second_inner_listener.str(),
                   listener);
    return true;
  }